

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::junit_reporter::do_benchmark_failure(junit_reporter *this,exception_ptr *e)

{
  ostream *poVar1;
  result *in_RSI;
  reporter *in_RDI;
  result *in_stack_ffffffffffffff38;
  
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::sample_analysis
            (&in_RSI->analysis);
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)in_RSI,(exception_ptr *)in_stack_ffffffffffffff38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>_>
                *)in_RSI,(key_type *)in_stack_ffffffffffffff38);
  result::operator=(in_RSI,in_stack_ffffffffffffff38);
  result::~result(in_RSI);
  poVar1 = reporter::error_stream(in_RDI);
  poVar1 = std::operator<<(poVar1,(string *)
                                  (in_RDI[2].os.super__Function_base._M_functor._M_pod_data + 8));
  std::operator<<(poVar1," failed to run successfully\n");
  return;
}

Assistant:

void do_benchmark_failure(std::exception_ptr e) override {
            data[current] = { sample_analysis<fp_seconds>(), e };
            error_stream() << current << " failed to run successfully\n";
        }